

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

u_char * ngx_strlcasestrn(u_char *s1,u_char *last,u_char *s2,size_t n)

{
  byte bVar1;
  byte bVar2;
  ngx_int_t nVar3;
  u_char *s1_00;
  ngx_uint_t c2;
  ngx_uint_t c1;
  size_t n_local;
  u_char *s2_local;
  u_char *last_local;
  u_char *s1_local;
  
  bVar1 = *s2;
  if ((0x40 < bVar1) && (bVar1 < 0x5b)) {
    bVar1 = bVar1 | 0x20;
  }
  s1_00 = s1;
  do {
    last_local = s1_00;
    if (last + -n <= last_local) {
      return (u_char *)0x0;
    }
    s1_00 = last_local + 1;
    bVar2 = *last_local;
    if ((0x40 < bVar2) && (bVar2 < 0x5b)) {
      bVar2 = bVar2 | 0x20;
    }
  } while ((bVar2 != bVar1) || (nVar3 = ngx_strncasecmp(s1_00,s2 + 1,n), nVar3 != 0));
  return last_local;
}

Assistant:

u_char *
ngx_strlcasestrn(u_char *s1, u_char *last, u_char *s2, size_t n)
{
    ngx_uint_t  c1, c2;

    c2 = (ngx_uint_t) *s2++;
    c2 = (c2 >= 'A' && c2 <= 'Z') ? (c2 | 0x20) : c2;
    last -= n;

    do {
        do {
            if (s1 >= last) {
                return NULL;
            }

            c1 = (ngx_uint_t) *s1++;

            c1 = (c1 >= 'A' && c1 <= 'Z') ? (c1 | 0x20) : c1;

        } while (c1 != c2);

    } while (ngx_strncasecmp(s1, s2, n) != 0);

    return --s1;
}